

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O1

m256v * m256v_get_subview(m256v *__return_storage_ptr__,m256v *M,int row_offs,int col_offs,int n_row
                         ,int n_col)

{
  size_t sVar1;
  
  __return_storage_ptr__->n_row = n_row;
  __return_storage_ptr__->n_col = n_col;
  sVar1 = M->rstride;
  __return_storage_ptr__->rstride = sVar1;
  __return_storage_ptr__->e = M->e + (long)col_offs + (long)row_offs * sVar1;
  return __return_storage_ptr__;
}

Assistant:

m256v m256v_get_subview(const m256v* M,
				int row_offs,
				int col_offs,
				int n_row,
				int n_col)
{
	assert(0 <= row_offs);
	assert(row_offs + n_row <= M->n_row);
	assert(0 <= col_offs);
	assert(col_offs + n_col <= M->n_col);

	m256v R;
	R.n_row = n_row;
	R.n_col = n_col;
	R.rstride = M->rstride;
	R.e = M->e + m256v_get_el_offs(M, row_offs, col_offs);

	return R;
}